

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

PyObject * pybind11::detail::make_object_base_type(PyTypeObject *metaclass)

{
  int iVar1;
  PyObject *pPVar2;
  handle *phVar3;
  error_already_set *this;
  object name_obj;
  handle local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_58.m_ptr = (PyObject *)PyUnicode_FromString("pybind11_object");
  pPVar2 = (*metaclass->tp_alloc)(metaclass,0);
  if (pPVar2 == (PyObject *)0x0) {
    pybind11_fail("make_object_base_type(): error allocating type!");
  }
  phVar3 = handle::inc_ref(&local_58);
  pPVar2[0x35].ob_refcnt = (Py_ssize_t)phVar3->m_ptr;
  phVar3 = handle::inc_ref(&local_58);
  pPVar2[0x36].ob_refcnt = (Py_ssize_t)phVar3->m_ptr;
  pPVar2[1].ob_type = (PyTypeObject *)"pybind11_object";
  _PyBaseObject_Type = _PyBaseObject_Type + 1;
  pPVar2[0x10].ob_refcnt = (Py_ssize_t)&PyBaseObject_Type;
  pPVar2[2].ob_refcnt = 0x38;
  pPVar2[10].ob_type = (PyTypeObject *)0x600;
  pPVar2[0x13].ob_type = (PyTypeObject *)pybind11_object_new;
  pPVar2[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  pPVar2[3].ob_refcnt = (Py_ssize_t)pybind11_object_dealloc;
  pPVar2[0xd].ob_refcnt = 0x28;
  iVar1 = PyType_Ready(pPVar2);
  if (iVar1 < 0) {
    error_string_abi_cxx11_();
    std::operator+(&local_50,"PyType_Ready failed in make_object_base_type(): ",&local_30);
    pybind11_fail(&local_50);
  }
  str::str((str *)&local_50,"pybind11_builtins");
  iVar1 = PyObject_SetAttrString(pPVar2,"__module__",local_50._M_dataplus._M_p);
  if (iVar1 != 0) {
    this = (error_already_set *)__cxa_allocate_exception(0x18);
    error_already_set::error_already_set(this);
    __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  handle::dec_ref((handle *)&local_50);
  if (((ulong)pPVar2[10].ob_type & 0x4000) == 0) {
    handle::dec_ref(&local_58);
    return pPVar2;
  }
  __assert_fail("!PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/detail/class.h"
                ,0x20f,"PyObject *pybind11::detail::make_object_base_type(PyTypeObject *)");
}

Assistant:

inline PyObject *make_object_base_type(PyTypeObject *metaclass) {
    constexpr auto *name = "pybind11_object";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto *heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type) {
        pybind11_fail("make_object_base_type(): error allocating type!");
    }

    heap_type->ht_name = name_obj.inc_ref().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto *type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = type_incref(&PyBaseObject_Type);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;

    type->tp_new = pybind11_object_new;
    type->tp_init = pybind11_object_init;
    type->tp_dealloc = pybind11_object_dealloc;

    /* Support weak references (needed for the keep_alive feature) */
    type->tp_weaklistoffset = offsetof(instance, weakrefs);

    if (PyType_Ready(type) < 0) {
        pybind11_fail("PyType_Ready failed in make_object_base_type(): " + error_string());
    }

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));
    PYBIND11_SET_OLDPY_QUALNAME(type, name_obj);

    assert(!PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));
    return (PyObject *) heap_type;
}